

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

ExceptionOr<kj::Promise<kj::HttpServer::Connection::LoopResult>_> * __thiscall
kj::_::ExceptionOr<kj::Promise<kj::HttpServer::Connection::LoopResult>_>::operator=
          (ExceptionOr<kj::Promise<kj::HttpServer::Connection::LoopResult>_> *this,
          ExceptionOr<kj::Promise<kj::HttpServer::Connection::LoopResult>_> *param_1)

{
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::HttpServer::Connection::LoopResult>_>_2
  aVar1;
  
  ExceptionOrValue::operator=(&this->super_ExceptionOrValue,&param_1->super_ExceptionOrValue);
  if (param_1 != this) {
    if ((this->value).ptr.isSet == true) {
      (this->value).ptr.isSet = false;
      aVar1 = (this->value).ptr.field_1;
      if (aVar1 != (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::HttpServer::Connection::LoopResult>_>_2
                    )0x0) {
        (this->value).ptr.field_1 =
             (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::HttpServer::Connection::LoopResult>_>_2
              )0x0;
        PromiseDisposer::dispose((PromiseArenaMember *)aVar1);
      }
    }
    if ((param_1->value).ptr.isSet == true) {
      (this->value).ptr.field_1 = (param_1->value).ptr.field_1;
      (param_1->value).ptr.field_1 =
           (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::HttpServer::Connection::LoopResult>_>_2
            )0x0;
      (this->value).ptr.isSet = true;
    }
  }
  if ((param_1->value).ptr.isSet == true) {
    (param_1->value).ptr.isSet = false;
    aVar1 = (param_1->value).ptr.field_1;
    if (aVar1 != (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::HttpServer::Connection::LoopResult>_>_2
                  )0x0) {
      (param_1->value).ptr.field_1 =
           (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::HttpServer::Connection::LoopResult>_>_2
            )0x0;
      PromiseDisposer::dispose((PromiseArenaMember *)aVar1);
    }
  }
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;